

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UText * __thiscall icu_63::RegexPattern::patternText(RegexPattern *this,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return (UText *)0x0;
  }
  *status = U_ZERO_ERROR;
  if (this->fPattern != (UText *)0x0) {
    return this->fPattern;
  }
  RegexStaticSets::initGlobals(status);
  return *(UText **)(RegexStaticSets::gStaticSets + 0x5d8);
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }